

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Valuator.cxx
# Opt level: O1

int __thiscall Fl_Valuator::format(Fl_Valuator *this,char *buffer)

{
  double dVar1;
  double dVar2;
  int iVar3;
  size_t sVar4;
  int iVar5;
  ulong uVar6;
  char temp [32];
  char local_38 [40];
  
  dVar1 = this->value_;
  dVar2 = this->A;
  if (((dVar2 == 0.0) && (!NAN(dVar2))) || (this->B == 0)) {
    iVar3 = snprintf(buffer,0x80,"%g",dVar1);
    return iVar3;
  }
  snprintf(local_38,0x20,"%.12f",dVar2 / (double)this->B);
  sVar4 = strlen(local_38);
  uVar6 = sVar4 & 0xffffffff;
  iVar3 = 1;
  if ((int)sVar4 < 1) {
    iVar3 = (int)sVar4;
  }
  do {
    uVar6 = uVar6 - 1;
    iVar5 = (int)sVar4;
    if (iVar5 < 2) {
      sVar4 = (size_t)(iVar3 - 1);
      iVar5 = iVar3;
      break;
    }
    sVar4 = (size_t)(iVar5 - 1);
  } while (local_38[uVar6 & 0xffffffff] == '0');
  if (1 < iVar5) {
    iVar3 = 1;
    if (1 < (int)sVar4) {
      iVar3 = (int)sVar4;
    }
    iVar5 = 0;
    do {
      if (9 < (int)local_38[sVar4] - 0x30U) break;
      sVar4 = (size_t)((int)sVar4 - 1);
      iVar5 = iVar5 + 1;
    } while (iVar3 != iVar5);
  }
  iVar3 = snprintf(buffer,0x80,"%.*f",dVar1);
  return iVar3;
}

Assistant:

int Fl_Valuator::format(char* buffer) {
  double v = value();
  // MRS: THIS IS A HACK - RECOMMEND ADDING BUFFER SIZE ARGUMENT
  if (!A || !B) return snprintf(buffer, 128, "%g", v);

  // Figure out how many digits are required to correctly format the
  // value.
  int i, c = 0;
  char temp[32];
  // output a number with many digits after the decimal point. This
  // seems to be needed to get high precission
  snprintf(temp, sizeof(temp), "%.12f", A/B);
  // strip all trailing 0's
  for (i=(int) strlen(temp)-1; i>0; i--) {
    if (temp[i]!='0') break;
  }
  // count digits until we find the decimal point (or comma or whatever
  // letter is set in the current locale)
  for (; i>0; i--, c++) {
    if (!isdigit(temp[i])) break;
  }

  // MRS: THIS IS A HACK - RECOMMEND ADDING BUFFER SIZE ARGUMENT
  return snprintf(buffer, 128, "%.*f", c, v);
}